

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

VNode * despot::DESPOT::Prune(VNode *vnode,ACT_TYPE *pruned_action,double *pruned_value)

{
  QNode *pQVar1;
  iterator __position;
  VNode *this;
  int iVar2;
  VNode *pVVar3;
  OBS_TYPE edge;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar4;
  pointer ppQVar5;
  QNode *this_00;
  vector<despot::QNode*,std::allocator<despot::QNode*>> *this_01;
  QNode *this_02;
  ulong uVar6;
  double dVar7;
  ValuedAction VVar8;
  QNode *qstar;
  vector<despot::State_*,_std::allocator<despot::State_*>_> empty;
  double nu;
  double local_90;
  QNode *local_88;
  double local_80;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  int *local_58;
  double *local_50;
  VNode *local_48;
  VNode *local_40;
  double local_38;
  
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar3 = (VNode *)operator_new(0x98);
  iVar2 = VNode::depth(vnode);
  edge = VNode::edge(vnode);
  VNode::VNode(pVVar3,&local_78,iVar2,(QNode *)0x0,edge);
  local_40 = vnode;
  pvVar4 = VNode::children(vnode);
  local_90 = -INFINITY;
  local_88 = (QNode *)0x0;
  ppQVar5 = (pvVar4->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = pruned_action;
  local_50 = pruned_value;
  local_48 = pVVar3;
  if ((pvVar4->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppQVar5) {
    local_90 = -INFINITY;
    iVar2 = -1;
    this_00 = (QNode *)0x0;
  }
  else {
    iVar2 = -1;
    uVar6 = 0;
    this_02 = (QNode *)0x0;
    do {
      pQVar1 = ppQVar5[uVar6];
      local_80 = local_90;
      this_00 = Prune(pQVar1,&local_38);
      local_90 = local_38;
      if (local_38 <= local_80) {
        QNode::~QNode(this_00);
        operator_delete(this_00,0x88);
        this_00 = this_02;
        local_90 = local_80;
        pQVar1 = local_88;
      }
      else {
        iVar2 = QNode::edge(pQVar1);
        pQVar1 = this_00;
        if (this_02 != (QNode *)0x0) {
          QNode::~QNode(this_02);
          operator_delete(this_02,0x88);
        }
      }
      local_88 = pQVar1;
      uVar6 = uVar6 + 1;
      ppQVar5 = (pvVar4->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      this_02 = this_00;
    } while (uVar6 < (ulong)((long)(pvVar4->
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar5 >> 3)
            );
  }
  this = local_40;
  VVar8 = VNode::default_move(local_40);
  pVVar3 = local_48;
  if (VVar8.value <= local_90) {
    this_01 = (vector<despot::QNode*,std::allocator<despot::QNode*>> *)VNode::children(local_48);
    __position._M_current = *(QNode ***)(this_01 + 8);
    if (__position._M_current == *(QNode ***)(this_01 + 0x10)) {
      std::vector<despot::QNode*,std::allocator<despot::QNode*>>::
      _M_realloc_insert<despot::QNode*const&>(this_01,__position,&local_88);
      this_00 = local_88;
    }
    else {
      *__position._M_current = this_00;
      *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    }
    QNode::parent(this_00,pVVar3);
  }
  else {
    VVar8 = VNode::default_move(this);
    local_90 = VVar8.value;
    VVar8 = VNode::default_move(this);
    iVar2 = VVar8.action;
    if (this_00 != (QNode *)0x0) {
      QNode::~QNode(this_00);
    }
    operator_delete(this_00,0x88);
  }
  dVar7 = VNode::lower_bound(this);
  VNode::lower_bound(pVVar3,dVar7);
  dVar7 = VNode::upper_bound(this);
  VNode::upper_bound(pVVar3,dVar7);
  *local_58 = iVar2;
  *local_50 = local_90;
  if (local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar3;
}

Assistant:

VNode* DESPOT::Prune(VNode* vnode, ACT_TYPE& pruned_action, double& pruned_value) {
	vector<State*> empty;
	VNode* pruned_v = new VNode(empty, vnode->depth(), NULL,
		vnode->edge());

	vector<QNode*>& children = vnode->children();
	ACT_TYPE astar = -1;
	double nustar = Globals::NEG_INFTY;
	QNode* qstar = NULL;
	for (int i = 0; i < children.size(); i++) {
		QNode* qnode = children[i];
		double nu;
		QNode* pruned_q = Prune(qnode, nu);

		if (nu > nustar) {
			nustar = nu;
			astar = qnode->edge();

			if (qstar != NULL) {
				delete qstar;
			}

			qstar = pruned_q;
		} else {
			delete pruned_q;
		}
	}

	if (nustar < vnode->default_move().value) {
		nustar = vnode->default_move().value;
		astar = vnode->default_move().action;
		delete qstar;
	} else {
		pruned_v->children().push_back(qstar);
		qstar->parent(pruned_v);
	}

	pruned_v->lower_bound(vnode->lower_bound()); // for debugging
	pruned_v->upper_bound(vnode->upper_bound());

	pruned_action = astar;
	pruned_value = nustar;

	return pruned_v;
}